

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::f_formatter<spdlog::details::scoped_padder>::format
          (f_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  uint uVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  uint32_or_64_or_128_t<unsigned_long> n;
  ulong value;
  scoped_padder p;
  scoped_padder local_60;
  char local_38 [21];
  char local_23 [3];
  char *local_20;
  
  lVar1 = (msg->time).__d.__r;
  value = (lVar1 / 1000000000) * -1000000 + lVar1 / 1000;
  scoped_padder::scoped_padder(&local_60,6,&(this->super_flag_formatter).padinfo_,dest);
  lVar1 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  uVar2 = (uint)(byte)::fmt::v11::detail::do_count_digits(unsigned_long)::bsr2log10[lVar1] -
          (uint)(value < *(ulong *)(::fmt::v11::detail::do_count_digits(unsigned_long)::
                                    zero_or_powers_of_10 +
                                   (ulong)(byte)::fmt::v11::detail::do_count_digits(unsigned_long)::
                                                bsr2log10[lVar1] * 8));
  if (uVar2 < 6) {
    iVar4 = 6 - uVar2;
    do {
      sVar3 = (dest->super_buffer<char>).size_;
      uVar5 = sVar3 + 1;
      if ((dest->super_buffer<char>).capacity_ < uVar5) {
        (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
        sVar3 = (dest->super_buffer<char>).size_;
        uVar5 = sVar3 + 1;
      }
      (dest->super_buffer<char>).size_ = uVar5;
      (dest->super_buffer<char>).ptr_[sVar3] = '0';
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  local_20 = ::fmt::v11::detail::do_format_decimal<char,unsigned_long>(local_38,value,0x15);
  ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_20,local_23);
  scoped_padder::~scoped_padder(&local_60);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        auto micros = fmt_helper::time_fraction<std::chrono::microseconds>(msg.time);

        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad6(static_cast<size_t>(micros.count()), dest);
    }